

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O0

void __thiscall QSqlResult::QSqlResult(QSqlResult *this,QSqlResultPrivate *dd)

{
  bool bVar1;
  NumericalPrecisionPolicy NVar2;
  undefined8 in_RSI;
  QSqlDriver *in_RDI;
  QSqlResultPrivate *d;
  
  *(undefined ***)in_RDI = &PTR__QSqlResult_0019b1a8;
  *(undefined8 *)&in_RDI->field_0x8 = in_RSI;
  d_func((QSqlResult *)0x1435e8);
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QSqlDriver> *)0x1435fb);
  if (bVar1) {
    QPointer<QSqlDriver>::operator->((QPointer<QSqlDriver> *)0x14360f);
    NVar2 = QSqlDriver::numericalPrecisionPolicy(in_RDI);
    (**(code **)(*(long *)in_RDI + 0xe8))(in_RDI,NVar2);
  }
  return;
}

Assistant:

QSqlResult::QSqlResult(QSqlResultPrivate &dd)
    : d_ptr(&dd)
{
    Q_D(QSqlResult);
    if (d->sqldriver)
        setNumericalPrecisionPolicy(d->sqldriver->numericalPrecisionPolicy());
}